

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

uint __thiscall QVariant::toUInt(QVariant *this,bool *ok)

{
  uint uVar1;
  bool *in_RDI;
  Private *unaff_retaddr;
  
  uVar1 = qNumVariantToHelper<unsigned_int>(unaff_retaddr,in_RDI);
  return uVar1;
}

Assistant:

uint QVariant::toUInt(bool *ok) const
{
    return qNumVariantToHelper<uint>(d, ok);
}